

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::Image::LabeledActions::add
          (LabeledActions *this,string *label,
          MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_> *action)

{
  int iVar1;
  Action *pAVar2;
  Action *pAVar3;
  MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_> *pMVar4;
  
  std::__cxx11::string::_M_assign((string *)(this->m_actions + this->m_numActions));
  iVar1 = this->m_numActions;
  pAVar2 = (action->
           super_UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>
           ).m_data.ptr;
  (action->super_UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>
  ).m_data.ptr = (Action *)0x0;
  pAVar3 = this->m_actions[iVar1].action.
           super_UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>
           .m_data.ptr;
  if (pAVar3 != pAVar2) {
    pMVar4 = &this->m_actions[iVar1].action;
    if (pAVar3 != (Action *)0x0) {
      (*pAVar3->_vptr_Action[1])();
      (pMVar4->
      super_UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>).
      m_data.ptr = (Action *)0x0;
    }
    (pMVar4->
    super_UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>).
    m_data.ptr = pAVar2;
  }
  this->m_numActions = this->m_numActions + 1;
  return;
}

Assistant:

void LabeledActions::add (const string& label, MovePtr<Action> action)
{
	DE_ASSERT(m_numActions < DE_LENGTH_OF_ARRAY(m_actions));
	m_actions[m_numActions].label = label;
	m_actions[m_numActions].action = action;
	++m_numActions;
}